

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<4,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  Geometry *this;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 (*pauVar29) [16];
  bool bVar30;
  bool bVar31;
  int iVar32;
  AABBNodeMB4D *node1;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong unaff_R14;
  size_t i;
  long lVar36;
  long lVar37;
  byte bVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  ulong local_1018;
  undefined1 (*local_1010) [16];
  long local_1008;
  ulong local_1000;
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar52 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar66 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    auVar52 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar66 = ZEXT1664(auVar52);
  }
  local_1010 = (undefined1 (*) [16])local_f68;
  local_1028 = *(float *)&(query->p).field_0;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  local_1038 = *(float *)((long)&(query->p).field_0 + 4);
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  local_1048 = *(float *)((long)&(query->p).field_0 + 8);
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  bVar31 = false;
  local_1018 = unaff_R14;
  do {
    auVar19._4_4_ = fStack_1024;
    auVar19._0_4_ = local_1028;
    auVar19._8_4_ = fStack_1020;
    auVar19._12_4_ = fStack_101c;
    local_fa8 = vsubps_avx(auVar19,auVar52);
    fVar7 = auVar52._0_4_;
    fVar8 = auVar52._4_4_;
    fVar9 = auVar52._8_4_;
    fVar10 = auVar52._12_4_;
    local_fb8 = local_1028 + fVar7;
    fStack_fb4 = fStack_1024 + fVar8;
    fStack_fb0 = fStack_1020 + fVar9;
    fStack_fac = fStack_101c + fVar10;
    auVar40._4_4_ = fStack_1034;
    auVar40._0_4_ = local_1038;
    auVar40._8_4_ = fStack_1030;
    auVar40._12_4_ = fStack_102c;
    local_fc8 = vsubps_avx(auVar40,auVar42);
    local_fd8 = local_1038 + auVar42._0_4_;
    fStack_fd4 = fStack_1034 + auVar42._4_4_;
    fStack_fd0 = fStack_1030 + auVar42._8_4_;
    fStack_fcc = fStack_102c + auVar42._12_4_;
    auVar44._4_4_ = fStack_1044;
    auVar44._0_4_ = local_1048;
    auVar44._8_4_ = fStack_1040;
    auVar44._12_4_ = fStack_103c;
    local_fe8 = vsubps_avx(auVar44,auVar46);
    local_ff8._0_4_ = local_1048 + auVar46._0_4_;
    local_ff8._4_4_ = fStack_1044 + auVar46._4_4_;
    local_ff8._8_4_ = fStack_1040 + auVar46._8_4_;
    local_ff8._12_4_ = fStack_103c + auVar46._12_4_;
    local_f88 = fVar7 * fVar7;
    fStack_f84 = fVar8 * fVar8;
    fStack_f80 = fVar9 * fVar9;
    fStack_f7c = fVar10 * fVar10;
    local_f98 = auVar66._0_16_;
    do {
      do {
        do {
          if (local_1010 == (undefined1 (*) [16])local_f78) {
            return bVar31;
          }
          pauVar29 = local_1010 + -1;
          local_1010 = local_1010 + -1;
        } while (auVar66._0_4_ < *(float *)(*pauVar29 + 8));
        uVar39 = *(ulong *)*local_1010;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar39 & 8) == 0) {
              uVar33 = uVar39 & 0xfffffffffffffff0;
              fVar7 = query->time;
              auVar59._4_4_ = fVar7;
              auVar59._0_4_ = fVar7;
              auVar59._8_4_ = fVar7;
              auVar59._12_4_ = fVar7;
              auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80),auVar59,
                                        *(undefined1 (*) [16])(uVar33 + 0x20));
              auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xa0),auVar59,
                                        *(undefined1 (*) [16])(uVar33 + 0x40));
              auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xc0),auVar59,
                                        *(undefined1 (*) [16])(uVar33 + 0x60));
              auVar19 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x90),auVar59,
                                        *(undefined1 (*) [16])(uVar33 + 0x30));
              auVar20 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xb0),auVar59,
                                        *(undefined1 (*) [16])(uVar33 + 0x50));
              auVar21 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xd0),auVar59,
                                        *(undefined1 (*) [16])(uVar33 + 0x70));
              auVar26._4_4_ = fStack_1024;
              auVar26._0_4_ = local_1028;
              auVar26._8_4_ = fStack_1020;
              auVar26._12_4_ = fStack_101c;
              auVar52 = vmaxps_avx(auVar26,auVar44);
              auVar52 = vminps_avx(auVar52,auVar19);
              auVar42 = vsubps_avx(auVar52,auVar26);
              auVar24._4_4_ = fStack_1034;
              auVar24._0_4_ = local_1038;
              auVar24._8_4_ = fStack_1030;
              auVar24._12_4_ = fStack_102c;
              auVar52 = vmaxps_avx(auVar24,auVar46);
              auVar52 = vminps_avx(auVar52,auVar20);
              auVar46 = vsubps_avx(auVar52,auVar24);
              auVar22._4_4_ = fStack_1044;
              auVar22._0_4_ = local_1048;
              auVar22._8_4_ = fStack_1040;
              auVar22._12_4_ = fStack_103c;
              auVar52 = vmaxps_avx(auVar22,auVar40);
              auVar52 = vminps_avx(auVar52,auVar21);
              auVar52 = vsubps_avx(auVar52,auVar22);
              local_1058._0_4_ =
                   auVar42._0_4_ * auVar42._0_4_ + auVar46._0_4_ * auVar46._0_4_ +
                   auVar52._0_4_ * auVar52._0_4_;
              local_1058._4_4_ =
                   auVar42._4_4_ * auVar42._4_4_ + auVar46._4_4_ * auVar46._4_4_ +
                   auVar52._4_4_ * auVar52._4_4_;
              fStack_1050 = auVar42._8_4_ * auVar42._8_4_ + auVar46._8_4_ * auVar46._8_4_ +
                            auVar52._8_4_ * auVar52._8_4_;
              fStack_104c = auVar42._12_4_ * auVar42._12_4_ + auVar46._12_4_ * auVar46._12_4_ +
                            auVar52._12_4_ * auVar52._12_4_;
              auVar21._4_4_ = fStack_f84;
              auVar21._0_4_ = local_f88;
              auVar21._8_4_ = fStack_f80;
              auVar21._12_4_ = fStack_f7c;
              uVar11 = vcmpps_avx512vl(_local_1058,auVar21,2);
              uVar12 = vcmpps_avx512vl(auVar44,auVar19,2);
              bVar38 = (byte)uVar11 & (byte)uVar12;
              if (((uint)uVar39 & 7) == 6) {
                uVar11 = vcmpps_avx512vl(auVar59,*(undefined1 (*) [16])(uVar33 + 0xf0),1);
                uVar12 = vcmpps_avx512vl(auVar59,*(undefined1 (*) [16])(uVar33 + 0xe0),0xd);
                bVar38 = (byte)uVar11 & (byte)uVar12 & bVar38;
              }
              local_1018 = CONCAT44((int)(local_1018 >> 0x20),(uint)bVar38);
            }
          }
          else if ((uVar39 & 8) == 0) {
            uVar33 = uVar39 & 0xfffffffffffffff0;
            fVar7 = query->time;
            auVar60._4_4_ = fVar7;
            auVar60._0_4_ = fVar7;
            auVar60._8_4_ = fVar7;
            auVar60._12_4_ = fVar7;
            auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x80),auVar60,
                                      *(undefined1 (*) [16])(uVar33 + 0x20));
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xa0),auVar60,
                                      *(undefined1 (*) [16])(uVar33 + 0x40));
            auVar19 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xc0),auVar60,
                                      *(undefined1 (*) [16])(uVar33 + 0x60));
            auVar20 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0x90),auVar60,
                                      *(undefined1 (*) [16])(uVar33 + 0x30));
            auVar21 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xb0),auVar60,
                                      *(undefined1 (*) [16])(uVar33 + 0x50));
            auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar33 + 0xd0),auVar60,
                                      *(undefined1 (*) [16])(uVar33 + 0x70));
            auVar27._4_4_ = fStack_1024;
            auVar27._0_4_ = local_1028;
            auVar27._8_4_ = fStack_1020;
            auVar27._12_4_ = fStack_101c;
            auVar52 = vmaxps_avx(auVar27,auVar44);
            auVar52 = vminps_avx(auVar52,auVar20);
            auVar42 = vsubps_avx(auVar52,auVar27);
            auVar25._4_4_ = fStack_1034;
            auVar25._0_4_ = local_1038;
            auVar25._8_4_ = fStack_1030;
            auVar25._12_4_ = fStack_102c;
            auVar52 = vmaxps_avx(auVar25,auVar40);
            auVar52 = vminps_avx(auVar52,auVar21);
            auVar46 = vsubps_avx(auVar52,auVar25);
            auVar23._4_4_ = fStack_1044;
            auVar23._0_4_ = local_1048;
            auVar23._8_4_ = fStack_1040;
            auVar23._12_4_ = fStack_103c;
            auVar52 = vmaxps_avx(auVar23,auVar19);
            auVar52 = vminps_avx(auVar52,auVar22);
            auVar52 = vsubps_avx(auVar52,auVar23);
            local_1058._4_4_ =
                 auVar52._4_4_ * auVar52._4_4_ +
                 auVar46._4_4_ * auVar46._4_4_ + auVar42._4_4_ * auVar42._4_4_;
            local_1058._0_4_ =
                 auVar52._0_4_ * auVar52._0_4_ +
                 auVar46._0_4_ * auVar46._0_4_ + auVar42._0_4_ * auVar42._0_4_;
            fStack_1050 = auVar52._8_4_ * auVar52._8_4_ +
                          auVar46._8_4_ * auVar46._8_4_ + auVar42._8_4_ * auVar42._8_4_;
            fStack_104c = auVar52._12_4_ * auVar52._12_4_ +
                          auVar46._12_4_ * auVar46._12_4_ + auVar42._12_4_ * auVar42._12_4_;
            uVar11 = vcmpps_avx512vl(auVar44,auVar20,2);
            uVar12 = vcmpps_avx512vl(auVar20,local_fa8,1);
            auVar28._4_4_ = fStack_fb4;
            auVar28._0_4_ = local_fb8;
            auVar28._8_4_ = fStack_fb0;
            auVar28._12_4_ = fStack_fac;
            uVar13 = vcmpps_avx512vl(auVar44,auVar28,6);
            uVar14 = vcmpps_avx512vl(auVar21,local_fc8,1);
            auVar20._4_4_ = fStack_fd4;
            auVar20._0_4_ = local_fd8;
            auVar20._8_4_ = fStack_fd0;
            auVar20._12_4_ = fStack_fcc;
            uVar15 = vcmpps_avx512vl(auVar40,auVar20,6);
            uVar16 = vcmpps_avx512vl(auVar22,local_fe8,1);
            uVar17 = vcmpps_avx512vl(auVar19,local_ff8,6);
            bVar38 = ~((byte)uVar15 | (byte)uVar13 | (byte)uVar17 | (byte)uVar12 | (byte)uVar14 |
                      (byte)uVar16) & (byte)uVar11;
            local_1018 = (ulong)bVar38;
            if (((uint)uVar39 & 7) == 6) {
              uVar11 = vcmpps_avx512vl(auVar60,*(undefined1 (*) [16])(uVar33 + 0xf0),1);
              uVar12 = vcmpps_avx512vl(auVar60,*(undefined1 (*) [16])(uVar33 + 0xe0),0xd);
              local_1018 = (ulong)((byte)uVar11 & (byte)uVar12 & bVar38);
            }
          }
          if ((uVar39 & 8) == 0) {
            if (local_1018 == 0) {
              iVar32 = 4;
            }
            else {
              uVar33 = uVar39 & 0xfffffffffffffff0;
              lVar34 = 0;
              for (uVar39 = local_1018; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000
                  ) {
                lVar34 = lVar34 + 1;
              }
              iVar32 = 0;
              uVar35 = local_1018 - 1 & local_1018;
              uVar39 = *(ulong *)(uVar33 + lVar34 * 8);
              if (uVar35 != 0) {
                uVar4 = *(uint *)(local_1058 + lVar34 * 4);
                lVar34 = 0;
                for (uVar18 = uVar35; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000)
                {
                  lVar34 = lVar34 + 1;
                }
                uVar35 = uVar35 - 1 & uVar35;
                uVar18 = *(ulong *)(uVar33 + lVar34 * 8);
                uVar3 = *(uint *)(local_1058 + lVar34 * 4);
                if (uVar35 == 0) {
                  if (uVar4 < uVar3) {
                    *(ulong *)*local_1010 = uVar18;
                    *(uint *)(*local_1010 + 8) = uVar3;
                    local_1010 = local_1010 + 1;
                  }
                  else {
                    *(ulong *)*local_1010 = uVar39;
                    *(uint *)(*local_1010 + 8) = uVar4;
                    uVar39 = uVar18;
                    local_1010 = local_1010 + 1;
                  }
                }
                else {
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = uVar39;
                  auVar52 = vpunpcklqdq_avx(auVar61,ZEXT416(uVar4));
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = uVar18;
                  auVar42 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar3));
                  lVar34 = 0;
                  for (uVar39 = uVar35; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000
                      ) {
                    lVar34 = lVar34 + 1;
                  }
                  uVar35 = uVar35 - 1 & uVar35;
                  auVar63._8_8_ = 0;
                  auVar63._0_8_ = *(ulong *)(uVar33 + lVar34 * 8);
                  auVar46 = vpunpcklqdq_avx(auVar63,ZEXT416(*(uint *)(local_1058 + lVar34 * 4)));
                  if (uVar35 == 0) {
                    auVar44 = vpshufd_avx(auVar52,0xaa);
                    auVar40 = vpshufd_avx(auVar42,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar40,auVar44);
                    uVar39 = uVar39 & 0xf;
                    auVar40 = vpblendmd_avx512vl(auVar42,auVar52);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar41._0_4_ = (uint)bVar30 * auVar40._0_4_ | (uint)!bVar30 * auVar44._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar41._4_4_ = (uint)bVar30 * auVar40._4_4_ | (uint)!bVar30 * auVar44._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar41._8_4_ = (uint)bVar30 * auVar40._8_4_ | (uint)!bVar30 * auVar44._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar41._12_4_ = (uint)bVar30 * auVar40._12_4_ | (uint)!bVar30 * auVar44._12_4_;
                    auVar42 = vmovdqa32_avx512vl(auVar42);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar43._0_4_ = (uint)bVar30 * auVar42._0_4_ | (uint)!bVar30 * auVar52._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar43._4_4_ = (uint)bVar30 * auVar42._4_4_ | (uint)!bVar30 * auVar52._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar43._8_4_ = (uint)bVar30 * auVar42._8_4_ | (uint)!bVar30 * auVar52._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar43._12_4_ = (uint)bVar30 * auVar42._12_4_ | (uint)!bVar30 * auVar52._12_4_;
                    auVar52 = vpshufd_avx(auVar41,0xaa);
                    auVar42 = vpshufd_avx(auVar46,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar42,auVar52);
                    uVar39 = uVar39 & 0xf;
                    auVar44 = vpblendmd_avx512vl(auVar46,auVar41);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    bVar6 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar42 = vmovdqa32_avx512vl(auVar46);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar45._0_4_ = (uint)bVar5 * auVar42._0_4_ | !bVar5 * auVar41._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar45._4_4_ = (uint)bVar5 * auVar42._4_4_ | !bVar5 * auVar41._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar45._8_4_ = (uint)bVar5 * auVar42._8_4_ | !bVar5 * auVar41._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar45._12_4_ = (uint)bVar5 * auVar42._12_4_ | !bVar5 * auVar41._12_4_;
                    auVar42 = vpshufd_avx(auVar45,0xaa);
                    auVar46 = vpshufd_avx(auVar43,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar42,auVar46);
                    uVar39 = uVar39 & 0xf;
                    auVar46 = vpblendmd_avx512vl(auVar45,auVar43);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar47._0_4_ = (uint)bVar5 * auVar46._0_4_ | (uint)!bVar5 * auVar42._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar47._4_4_ = (uint)bVar5 * auVar46._4_4_ | (uint)!bVar5 * auVar42._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar47._8_4_ = (uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * auVar42._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar47._12_4_ = (uint)bVar5 * auVar46._12_4_ | (uint)!bVar5 * auVar42._12_4_;
                    auVar42 = vmovdqa32_avx512vl(auVar45);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar48._0_4_ = (uint)bVar5 * auVar42._0_4_ | !bVar5 * auVar43._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar48._4_4_ = (uint)bVar5 * auVar42._4_4_ | !bVar5 * auVar43._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar48._8_4_ = (uint)bVar5 * auVar42._8_4_ | !bVar5 * auVar43._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar48._12_4_ = (uint)bVar5 * auVar42._12_4_ | !bVar5 * auVar43._12_4_;
                    *local_1010 = auVar48;
                    local_1010[1] = auVar47;
                    uVar39 = CONCAT44((uint)bVar6 * auVar44._4_4_ | (uint)!bVar6 * auVar52._4_4_,
                                      (uint)bVar30 * auVar44._0_4_ | (uint)!bVar30 * auVar52._0_4_);
                    local_1010 = local_1010 + 2;
                  }
                  else {
                    lVar34 = 0;
                    for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                      lVar34 = lVar34 + 1;
                    }
                    uVar4 = *(uint *)(local_1058 + lVar34 * 4);
                    auVar64._8_8_ = 0;
                    auVar64._0_8_ = *(ulong *)(uVar33 + lVar34 * 8);
                    auVar19 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar4));
                    auVar44 = vpshufd_avx(auVar52,0xaa);
                    auVar40 = vpshufd_avx(auVar42,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar40,auVar44);
                    uVar39 = uVar39 & 0xf;
                    auVar40 = vpblendmd_avx512vl(auVar42,auVar52);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar49._0_4_ = (uint)bVar30 * auVar40._0_4_ | (uint)!bVar30 * auVar44._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar49._4_4_ = (uint)bVar30 * auVar40._4_4_ | (uint)!bVar30 * auVar44._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar49._8_4_ = (uint)bVar30 * auVar40._8_4_ | (uint)!bVar30 * auVar44._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar49._12_4_ = (uint)bVar30 * auVar40._12_4_ | (uint)!bVar30 * auVar44._12_4_;
                    auVar42 = vmovdqa32_avx512vl(auVar42);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar50._0_4_ = (uint)bVar30 * auVar42._0_4_ | (uint)!bVar30 * auVar52._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar50._4_4_ = (uint)bVar30 * auVar42._4_4_ | (uint)!bVar30 * auVar52._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar50._8_4_ = (uint)bVar30 * auVar42._8_4_ | (uint)!bVar30 * auVar52._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar50._12_4_ = (uint)bVar30 * auVar42._12_4_ | (uint)!bVar30 * auVar52._12_4_;
                    auVar52 = vpshufd_avx(auVar46,0xaa);
                    auVar65._4_4_ = uVar4;
                    auVar65._0_4_ = uVar4;
                    auVar65._8_4_ = uVar4;
                    auVar65._12_4_ = uVar4;
                    uVar39 = vpcmpgtd_avx512vl(auVar65,auVar52);
                    uVar39 = uVar39 & 0xf;
                    auVar42 = vpblendmd_avx512vl(auVar19,auVar46);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar51._0_4_ = (uint)bVar30 * auVar42._0_4_ | (uint)!bVar30 * auVar52._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar51._4_4_ = (uint)bVar30 * auVar42._4_4_ | (uint)!bVar30 * auVar52._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar51._8_4_ = (uint)bVar30 * auVar42._8_4_ | (uint)!bVar30 * auVar52._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar51._12_4_ = (uint)bVar30 * auVar42._12_4_ | (uint)!bVar30 * auVar52._12_4_;
                    auVar52 = vmovdqa32_avx512vl(auVar19);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar53._0_4_ = (uint)bVar30 * auVar52._0_4_ | (uint)!bVar30 * auVar46._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar53._4_4_ = (uint)bVar30 * auVar52._4_4_ | (uint)!bVar30 * auVar46._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar53._8_4_ = (uint)bVar30 * auVar52._8_4_ | (uint)!bVar30 * auVar46._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar53._12_4_ = (uint)bVar30 * auVar52._12_4_ | (uint)!bVar30 * auVar46._12_4_;
                    auVar52 = vpshufd_avx(auVar53,0xaa);
                    auVar42 = vpshufd_avx(auVar50,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar52,auVar42);
                    uVar39 = uVar39 & 0xf;
                    auVar42 = vpblendmd_avx512vl(auVar53,auVar50);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar54._0_4_ = (uint)bVar30 * auVar42._0_4_ | (uint)!bVar30 * auVar52._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar54._4_4_ = (uint)bVar30 * auVar42._4_4_ | (uint)!bVar30 * auVar52._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar54._8_4_ = (uint)bVar30 * auVar42._8_4_ | (uint)!bVar30 * auVar52._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar54._12_4_ = (uint)bVar30 * auVar42._12_4_ | (uint)!bVar30 * auVar52._12_4_;
                    auVar52 = vmovdqa32_avx512vl(auVar53);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    auVar55._0_4_ = (uint)bVar30 * auVar52._0_4_ | !bVar30 * auVar50._0_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar55._4_4_ = (uint)bVar30 * auVar52._4_4_ | !bVar30 * auVar50._4_4_;
                    bVar30 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar55._8_4_ = (uint)bVar30 * auVar52._8_4_ | !bVar30 * auVar50._8_4_;
                    bVar30 = SUB81(uVar39 >> 3,0);
                    auVar55._12_4_ = (uint)bVar30 * auVar52._12_4_ | !bVar30 * auVar50._12_4_;
                    auVar52 = vpshufd_avx(auVar51,0xaa);
                    auVar42 = vpshufd_avx(auVar49,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar52,auVar42);
                    uVar39 = uVar39 & 0xf;
                    auVar44 = vpblendmd_avx512vl(auVar51,auVar49);
                    bVar30 = (bool)((byte)uVar39 & 1);
                    bVar6 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar42 = vmovdqa32_avx512vl(auVar51);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar56._0_4_ = (uint)bVar5 * auVar42._0_4_ | !bVar5 * auVar49._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar56._4_4_ = (uint)bVar5 * auVar42._4_4_ | !bVar5 * auVar49._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar56._8_4_ = (uint)bVar5 * auVar42._8_4_ | !bVar5 * auVar49._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar56._12_4_ = (uint)bVar5 * auVar42._12_4_ | !bVar5 * auVar49._12_4_;
                    auVar42 = vpshufd_avx(auVar56,0xaa);
                    auVar46 = vpshufd_avx(auVar54,0xaa);
                    uVar39 = vpcmpgtd_avx512vl(auVar46,auVar42);
                    uVar39 = uVar39 & 0xf;
                    auVar46 = vpblendmd_avx512vl(auVar54,auVar56);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar57._0_4_ = (uint)bVar5 * auVar46._0_4_ | (uint)!bVar5 * auVar42._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar57._4_4_ = (uint)bVar5 * auVar46._4_4_ | (uint)!bVar5 * auVar42._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar57._8_4_ = (uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * auVar42._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar57._12_4_ = (uint)bVar5 * auVar46._12_4_ | (uint)!bVar5 * auVar42._12_4_;
                    auVar42 = vmovdqa32_avx512vl(auVar54);
                    bVar5 = (bool)((byte)uVar39 & 1);
                    auVar58._0_4_ = (uint)bVar5 * auVar42._0_4_ | !bVar5 * auVar56._0_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar58._4_4_ = (uint)bVar5 * auVar42._4_4_ | !bVar5 * auVar56._4_4_;
                    bVar5 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar58._8_4_ = (uint)bVar5 * auVar42._8_4_ | !bVar5 * auVar56._8_4_;
                    bVar5 = SUB81(uVar39 >> 3,0);
                    auVar58._12_4_ = (uint)bVar5 * auVar42._12_4_ | !bVar5 * auVar56._12_4_;
                    *local_1010 = auVar55;
                    local_1010[1] = auVar58;
                    local_1010[2] = auVar57;
                    uVar39 = CONCAT44((uint)bVar6 * auVar44._4_4_ | (uint)!bVar6 * auVar52._4_4_,
                                      (uint)bVar30 * auVar44._0_4_ | (uint)!bVar30 * auVar52._0_4_);
                    local_1010 = local_1010 + 3;
                    iVar32 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar32 = 6;
          }
        } while (iVar32 == 0);
      } while ((iVar32 != 6) || (local_1008 = (ulong)((uint)uVar39 & 0xf) - 8, local_1008 == 0));
      lVar34 = (uVar39 & 0xfffffffffffffff0) + 0x40;
      lVar37 = 0;
      uVar39 = 0;
      do {
        local_1000 = uVar39;
        bVar38 = 0;
        lVar36 = 0;
        do {
          if (*(int *)(lVar34 + lVar36 * 4) == -1) break;
          uVar4 = *(uint *)(lVar34 + -0x10 + lVar36 * 4);
          this = (context->scene->geometries).items[uVar4].ptr;
          context->geomID = uVar4;
          context->primID = *(uint *)(lVar34 + lVar36 * 4);
          bVar30 = Geometry::pointQuery(this,query,context);
          bVar38 = bVar38 | bVar30;
          lVar36 = lVar36 + 1;
        } while (lVar36 != 4);
        uVar39 = CONCAT71((int7)(local_1000 >> 8),(byte)local_1000 | bVar38);
        lVar37 = lVar37 + 1;
        lVar34 = lVar34 + 0x50;
      } while (lVar37 != local_1008);
      auVar66 = ZEXT1664(local_f98);
    } while ((local_1000 & 1) == 0 && bVar38 == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar52._4_4_ = uVar1;
    auVar52._0_4_ = uVar1;
    auVar52._8_4_ = uVar1;
    auVar52._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar42._4_4_ = uVar1;
    auVar42._0_4_ = uVar1;
    auVar42._8_4_ = uVar1;
    auVar42._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar46._4_4_ = uVar1;
    auVar46._0_4_ = uVar1;
    auVar46._8_4_ = uVar1;
    auVar46._12_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar66 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      auVar44 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
      auVar66 = ZEXT1664(auVar44);
    }
    bVar31 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }